

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::rowReduceFromGaussian(Matrix *this)

{
  long lVar1;
  double **ppdVar2;
  uint uVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  double **extraout_RDX;
  double **ppdVar10;
  int iVar11;
  Matrix *in_RSI;
  uint uVar12;
  ulong uVar13;
  double **ppdVar14;
  long lVar15;
  double dVar16;
  Matrix MVar17;
  
  Matrix(this,in_RSI);
  iVar9 = this->rows_;
  ppdVar10 = extraout_RDX;
  if (0 < (long)iVar9) {
    uVar3 = this->cols_;
    ppdVar10 = (double **)(ulong)(uVar3 - 2);
    ppdVar4 = this->p;
    uVar12 = iVar9 - 2;
    lVar8 = (long)iVar9;
    do {
      lVar1 = lVar8 + -1;
      if (0 < (int)ppdVar10) {
        ppdVar14 = ppdVar10;
        do {
          ppdVar2 = (double **)((long)ppdVar14 - 1);
          if (ppdVar4[lVar1][(long)ppdVar14 - 1] != 0.0) {
            ppdVar10 = (double **)((ulong)ppdVar2 & 0xffffffff);
          }
          if (NAN(ppdVar4[lVar1][(long)ppdVar14 - 1])) {
            ppdVar10 = (double **)((ulong)ppdVar2 & 0xffffffff);
          }
          bVar7 = 1 < (long)ppdVar14;
          ppdVar14 = ppdVar2;
        } while (bVar7);
      }
      uVar13 = (ulong)uVar12;
      pdVar5 = ppdVar4[lVar1];
      iVar9 = (int)ppdVar10;
      if ((pdVar5[iVar9] != 0.0) || (NAN(pdVar5[iVar9]))) {
        if (1 < lVar8) {
          do {
            if (0 < (int)uVar3) {
              ppdVar14 = (double **)0x0;
              do {
                if (ppdVar10 != ppdVar14) {
                  pdVar6 = ppdVar4[uVar13];
                  dVar16 = pdVar6[(long)ppdVar14] -
                           (pdVar6[iVar9] / pdVar5[iVar9]) * pdVar5[(long)ppdVar14];
                  pdVar6[(long)ppdVar14] = (double)(~-(ulong)(ABS(dVar16) < 1e-10) & (ulong)dVar16);
                }
                ppdVar14 = (double **)((long)ppdVar14 + 1);
              } while ((double **)(ulong)uVar3 != ppdVar14);
            }
            ppdVar4[uVar13][iVar9] = 0.0;
            iVar11 = (int)uVar13;
            uVar13 = uVar13 - 1;
          } while (0 < iVar11);
        }
        iVar11 = iVar9 + 1;
        if (iVar11 < (int)uVar3) {
          lVar15 = 0;
          do {
            pdVar5[iVar11 + lVar15] =
                 (double)(~-(ulong)(ABS(pdVar5[iVar11 + lVar15] / pdVar5[iVar9]) < 1e-10) &
                         (ulong)(pdVar5[iVar11 + lVar15] / pdVar5[iVar9]));
            lVar15 = lVar15 + 1;
          } while ((uVar3 - 1) - iVar9 != (int)lVar15);
        }
        pdVar5[iVar9] = 1.0;
      }
      ppdVar10 = (double **)(ulong)(iVar9 - 1);
      uVar12 = uVar12 - 1;
      bVar7 = 1 < lVar8;
      lVar8 = lVar1;
    } while (bVar7);
  }
  MVar17.p = ppdVar10;
  MVar17._0_8_ = this;
  return MVar17;
}

Assistant:

Matrix Matrix::rowReduceFromGaussian()
{
    Matrix R(*this);
    int rows = R.rows_;
    int cols = R.cols_;

    int i = rows - 1; // row tracker
    int j = cols - 2; // column tracker

    // iterate through every row
    while (i >= 0)
    {
        // find the pivot column
        int k = j - 1;
        while (k >= 0) {
            if (R(i, k) != 0)
                j = k;
            k--;
        }

        // zero out elements above pivots if pivot not 0
        if (R(i, j) != 0) {

            for (int t = i - 1; t >= 0; --t) {
                for (int s = 0; s < cols; ++s) {
                    if (s != j) {
                        R(t, s) = R(t, s) - R(i, s) * (R(t, j) / R(i, j));
                        if (R(t, s) < EPS && R(t, s) > -1*EPS)
                            R(t, s) = 0;
                    }
                }
                R(t, j) = 0;
            }

            // divide row by pivot
            for (int k = j + 1; k < cols; ++k) {
                R(i, k) = R(i, k) / R(i, j);
                if (R(i, k) < EPS && R(i, k) > -1*EPS)
                    R(i, k) = 0;
            }
            R(i, j) = 1;

        }

        i--;
        j--;
    }

    return R;
}